

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

void Wlc_NtkTrace_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,int iFrame,Vec_Int_t *vMemObjs,Vec_Wrd_t *vValues
                     ,word ValueA,Vec_Int_t *vRes)

{
  Vec_Int_t *p_00;
  ushort uVar1;
  int iVar2;
  int iVar3;
  word wVar4;
  Wlc_Obj_t *pWVar5;
  ushort uVar6;
  int i;
  uint Entry;
  
  while( true ) {
    i = (int)(((long)pObj - (long)p->pObjs) / 0x18);
    iVar2 = Vec_IntEntry(&p->vCopies,i);
    iVar3 = Vec_IntEntry(vMemObjs,iVar2);
    if (iVar3 != i) {
      __assert_fail("iObj == Vec_IntEntry(vMemObjs, iNum)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                    ,0x311,
                    "void Wlc_NtkTrace_rec(Wlc_Ntk_t *, Wlc_Obj_t *, int, Vec_Int_t *, Vec_Wrd_t *, word, Vec_Int_t *)"
                   );
    }
    if (iFrame < 0) {
      __assert_fail("iFrame >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                    ,0x312,
                    "void Wlc_NtkTrace_rec(Wlc_Ntk_t *, Wlc_Obj_t *, int, Vec_Int_t *, Vec_Wrd_t *, word, Vec_Int_t *)"
                   );
    }
    uVar1 = *(ushort *)pObj & 0x3f;
    if (uVar1 == 1) break;
    uVar6 = *(ushort *)pObj & 0x3d;
    if ((iFrame == 0) && (uVar6 == 1)) {
      p_00 = p->vInits;
      iVar2 = Wlc_ObjCiId(pObj);
      iVar2 = Vec_IntEntry(p_00,iVar2 - (p->vPis).nSize);
      pWVar5 = Wlc_NtkPi(p,iVar2);
      Entry = (int)(((long)pWVar5 - (long)p->pObjs) / 0x18) << 0xb;
      goto LAB_003042dd;
    }
    if (uVar6 == 1) {
      pObj = Wlc_ObjFo2Fi(p,pObj);
      iFrame = iFrame + -1;
    }
    else {
      if (uVar1 != 7) {
        if (uVar1 != 0x37) {
          if (uVar1 != 8) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                          ,0x32e,
                          "void Wlc_NtkTrace_rec(Wlc_Ntk_t *, Wlc_Obj_t *, int, Vec_Int_t *, Vec_Wrd_t *, word, Vec_Int_t *)"
                         );
          }
          Vec_WrdEntry(vValues,(iFrame * vMemObjs->nSize + iVar2) * 3);
          __assert_fail("Value == 0 && Value == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                        ,0x323,
                        "void Wlc_NtkTrace_rec(Wlc_Ntk_t *, Wlc_Obj_t *, int, Vec_Int_t *, Vec_Wrd_t *, word, Vec_Int_t *)"
                       );
        }
        wVar4 = Vec_WrdEntry(vValues,(vMemObjs->nSize * iFrame + iVar2) * 3 + 1);
        if (wVar4 != ValueA) {
          pWVar5 = Wlc_ObjFanin0(p,pObj);
          Wlc_NtkTrace_rec(p,pWVar5,iFrame,vMemObjs,vValues,ValueA,vRes);
        }
        Entry = iFrame * 2 | i << 0xb;
        goto LAB_003042dd;
      }
      pObj = Wlc_ObjFanin0(p,pObj);
    }
  }
  Entry = iFrame * 2 | i << 0xb;
LAB_003042dd:
  Vec_IntPush(vRes,Entry);
  return;
}

Assistant:

void Wlc_NtkTrace_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, int iFrame, Vec_Int_t * vMemObjs, Vec_Wrd_t * vValues, word ValueA, Vec_Int_t * vRes )
{
    int iObj = Wlc_ObjId(p, pObj);
    int iNum = Wlc_ObjCopy( p, iObj );
    assert( iObj == Vec_IntEntry(vMemObjs, iNum) );
    assert( iFrame >= 0 );
    if ( Wlc_ObjIsPi(pObj) ) 
        Vec_IntPush( vRes, (iObj << 11) | (iFrame << 1) );
    else if ( Wlc_ObjIsCi(pObj) && iFrame == 0 ) 
    {
        int PiId = Vec_IntEntry(p->vInits, Wlc_ObjCiId(pObj)-Wlc_NtkPiNum(p) );
        int iPiObj = Wlc_ObjId( p, Wlc_NtkPi(p, PiId) );
        Vec_IntPush( vRes, (iPiObj << 11) | (iFrame << 1) );
    }
    else if ( Wlc_ObjIsCi(pObj) )
        Wlc_NtkTrace_rec( p, Wlc_ObjFo2Fi(p, pObj), iFrame - 1, vMemObjs, vValues, ValueA, vRes );
    else if ( Wlc_ObjType(pObj) == WLC_OBJ_BUF )
        Wlc_NtkTrace_rec( p, Wlc_ObjFanin0(p, pObj), iFrame, vMemObjs, vValues, ValueA, vRes );
    else if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
    {
        int Index = 3*(iFrame*Vec_IntSize(vMemObjs) + iNum);
        int Value = (int)Vec_WrdEntry( vValues, Index );
        assert( Value == 0 && Value == 1 );
        Wlc_NtkTrace_rec( p, Value ? Wlc_ObjFanin2(p, pObj) : Wlc_ObjFanin1(p, pObj), iFrame, vMemObjs, vValues, ValueA, vRes );
        Vec_IntPush( vRes, (iObj << 11) | (iFrame << 1) | Value );
    }
    else if ( Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
    {
        int Index = 3*(iFrame*Vec_IntSize(vMemObjs) + iNum);
        if ( Vec_WrdEntry(vValues, Index + 1) != ValueA ) // address 
            Wlc_NtkTrace_rec( p, Wlc_ObjFanin0(p, pObj), iFrame, vMemObjs, vValues, ValueA, vRes );
        Vec_IntPush( vRes, (iObj << 11) | (iFrame << 1) );
    }
    else assert( 0 );
}